

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O3

pair bucket_get_pair(bucket b,comparable_callback compare_cb,void *key)

{
  pair ppVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (b->pairs == (pair)0x0) {
    return (pair)0x0;
  }
  if (b->count != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      ppVar1 = b->pairs;
      iVar2 = (*compare_cb)(key,*(comparable *)((long)&ppVar1->key + lVar4));
      if (iVar2 == 0) {
        return (pair)((long)&ppVar1->key + lVar4);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < b->count);
  }
  return (pair)0x0;
}

Assistant:

pair bucket_get_pair(bucket b, comparable_callback compare_cb, void *key)
{
	size_t iterator;

	if (b->pairs == NULL || b->count == 0)
	{
		return NULL;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			return p;
		}
	}

	return NULL;
}